

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O2

bool wasm::ParamUtils::removeParameter
               (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs,Index index,
               vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
               vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs,Module *module,
               PassRunner *runner)

{
  HeapType *pHVar1;
  pointer *pppFVar2;
  pointer ppFVar3;
  Function *pFVar4;
  Function *pFVar5;
  Call **ppCVar6;
  pointer ppCVar7;
  pointer puVar8;
  bool bVar9;
  const_iterator __begin2;
  pointer ppFVar10;
  Type TVar11;
  char *__function;
  TaskFunc p_Var12;
  __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
  _Var13;
  pointer ppCVar14;
  pointer puVar15;
  __normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
  __it;
  char *__file;
  pointer *__src;
  char *__assertion;
  Name *this;
  long lVar16;
  __normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
  _Var17;
  __normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
  __it_00;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  Iterator __first;
  Iterator it;
  Iterator it_00;
  Signature SVar21;
  Iterator __last;
  LocalUpdater local_1c8;
  undefined1 local_e0 [8];
  anon_class_24_3_97fb837d hasBadEffects;
  Type paramsType;
  PassRunner *runner_local;
  Function *local_b0;
  HeapType *local_a8;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *local_a0;
  undefined1 auStack_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> newIndexes;
  Module *local_78;
  Module *module_local;
  Index local_64;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *local_60;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Index index_local;
  
  ppFVar10 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar3 = (funcs->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  paramsType.id = (uintptr_t)runner;
  local_78 = module;
  module_local = (Module *)callRefs;
  local_60 = funcs;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = index;
  if (ppFVar3 == ppFVar10) {
    __assertion = "funcs.size() > 0";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
    ;
    __function = 
    "bool wasm::ParamUtils::removeParameter(const std::vector<Function *> &, Index, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
    ;
    uVar18 = 0x36;
  }
  else {
    pFVar4 = *ppFVar10;
    pHVar1 = &pFVar4->type;
    do {
      if (ppFVar10 == ppFVar3) {
        local_e0 = (undefined1  [8])&paramsType;
        __range2 = (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)local_e0;
        hasBadEffects.runner = (PassRunner **)&local_78;
        hasBadEffects.module =
             (Module **)
             ((long)&params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4);
        __it_00._M_current =
             (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
        ppCVar6 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar16 = (long)ppCVar6 - (long)__it_00._M_current;
        lVar19 = lVar16 >> 5;
        local_b0 = pFVar4;
        local_a8 = pHVar1;
        local_a0 = calls;
        goto LAB_007aa12d;
      }
      pFVar5 = *ppFVar10;
      ppFVar10 = ppFVar10 + 1;
    } while ((pFVar5->type).id == pHVar1->id);
    __assertion = "func->type == first->type";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
    ;
    __function = 
    "bool wasm::ParamUtils::removeParameter(const std::vector<Function *> &, Index, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
    ;
    uVar18 = 0x3a;
  }
LAB_007aa611:
  __assert_fail(__assertion,__file,uVar18,__function);
LAB_007aa12d:
  _Var13._M_current = __it_00._M_current;
  if (lVar19 < 1) goto LAB_007aa187;
  bVar9 = __gnu_cxx::__ops::
          _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
          ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                        *)&__range2,__it_00);
  if (bVar9) goto LAB_007aa1c0;
  bVar9 = __gnu_cxx::__ops::
          _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
          ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                        *)&__range2,
                       (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                        )(__it_00._M_current + 1));
  _Var13._M_current = __it_00._M_current + 1;
  if (bVar9) goto LAB_007aa1c0;
  bVar9 = __gnu_cxx::__ops::
          _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
          ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                        *)&__range2,
                       (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                        )(__it_00._M_current + 2));
  _Var13._M_current = __it_00._M_current + 2;
  if (bVar9) goto LAB_007aa1c0;
  bVar9 = __gnu_cxx::__ops::
          _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
          ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                        *)&__range2,
                       (__normal_iterator<wasm::Call_*const_*,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                        )(__it_00._M_current + 3));
  _Var13._M_current = __it_00._M_current + 3;
  if (bVar9) goto LAB_007aa1c0;
  __it_00._M_current = __it_00._M_current + 4;
  lVar19 = lVar19 + -1;
  lVar16 = lVar16 + -0x20;
  goto LAB_007aa12d;
LAB_007aa187:
  lVar16 = lVar16 >> 3;
  if (lVar16 == 1) {
LAB_007aa585:
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                          *)&__range2,__it_00);
    _Var13._M_current = __it_00._M_current;
    if (!bVar9) {
      _Var13._M_current = ppCVar6;
    }
LAB_007aa1c0:
    if (_Var13._M_current != ppCVar6) {
      return false;
    }
  }
  else {
    if (lVar16 == 2) {
LAB_007aa56d:
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                            *)&__range2,__it_00);
      _Var13._M_current = __it_00._M_current;
      if (!bVar9) {
        __it_00._M_current = __it_00._M_current + 1;
        goto LAB_007aa585;
      }
      goto LAB_007aa1c0;
    }
    if (lVar16 == 3) {
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_1>
              ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__1>
                            *)&__range2,__it_00);
      if (!bVar9) {
        __it_00._M_current = __it_00._M_current + 1;
        goto LAB_007aa56d;
      }
      goto LAB_007aa1c0;
    }
  }
  __it._M_current =
       (CallRef **)
       (module_local->exports).
       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar15 = (module_local->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __range2 = (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)local_e0;
  lVar19 = (long)puVar15 - (long)__it._M_current;
  for (lVar16 = lVar19 >> 5; _Var17._M_current = __it._M_current, 0 < lVar16; lVar16 = lVar16 + -1)
  {
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          *)&__range2,__it);
    if (bVar9) goto LAB_007aa283;
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          *)&__range2,
                         (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                          )(__it._M_current + 1));
    _Var17._M_current = __it._M_current + 1;
    if (bVar9) goto LAB_007aa283;
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          *)&__range2,
                         (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                          )(__it._M_current + 2));
    _Var17._M_current = __it._M_current + 2;
    if (bVar9) goto LAB_007aa283;
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          *)&__range2,
                         (__normal_iterator<wasm::CallRef_*const_*,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                          )(__it._M_current + 3));
    _Var17._M_current = __it._M_current + 3;
    if (bVar9) goto LAB_007aa283;
    __it._M_current = __it._M_current + 4;
    lVar19 = lVar19 + -0x20;
  }
  lVar19 = lVar19 >> 3;
  if (lVar19 == 1) {
LAB_007aa5c1:
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          *)&__range2,__it);
    _Var17._M_current = __it._M_current;
    if (!bVar9) {
      _Var17._M_current = (CallRef **)puVar15;
    }
  }
  else if (lVar19 == 2) {
LAB_007aa5a9:
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          *)&__range2,__it);
    _Var17._M_current = __it._M_current;
    if (!bVar9) {
      __it._M_current = __it._M_current + 1;
      goto LAB_007aa5c1;
    }
  }
  else {
    if (lVar19 != 3) goto LAB_007aa28c;
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::$_2>
            ::operator()((_Iter_pred<wasm::ParamUtils::removeParameter(std::vector<wasm::Function*,std::allocator<wasm::Function*>>const&,unsigned_int,std::vector<wasm::Call*,std::allocator<wasm::Call*>>const&,std::vector<wasm::CallRef*,std::allocator<wasm::CallRef*>>const&,wasm::Module*,wasm::PassRunner*)::__2>
                          *)&__range2,__it);
    if (!bVar9) {
      __it._M_current = __it._M_current + 1;
      goto LAB_007aa5a9;
    }
  }
LAB_007aa283:
  if ((pointer)_Var17._M_current != puVar15) {
    return false;
  }
LAB_007aa28c:
  TVar11 = Function::getLocalType
                     (local_b0,params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  bVar9 = TypeUpdating::canHandleAsLocal(TVar11);
  if (!bVar9) {
    return false;
  }
  SVar21 = HeapType::getSignature(local_a8);
  hasBadEffects.index = (Index *)SVar21.params.id;
  __last = wasm::Type::end((Type *)&hasBadEffects.index);
  __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
       (Type *)&hasBadEffects.index;
  std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
            ((vector<wasm::Type,std::allocator<wasm::Type>> *)&__range2,__first,__last,
             (allocator_type *)auStack_98);
  pppFVar2 = &(__range2->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
              _M_impl.super__Vector_impl_data._M_start +
             params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
  __src = pppFVar2 + 1;
  TVar11.id = (uintptr_t)*pppFVar2;
  if ((pointer)__src !=
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start) {
    memmove(&(__range2->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
             _M_impl.super__Vector_impl_data._M_start +
            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_,__src,
            (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)__src);
  }
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start + -1;
  ppFVar3 = (local_60->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar10 = (local_60->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppFVar10 != ppFVar3;
      ppFVar10 = ppFVar10 + 1) {
    pFVar4 = *ppFVar10;
    Tuple::Tuple((Tuple *)auStack_98,(TypeList *)&__range2);
    wasm::Type::Type((Type *)&runner_local,(Tuple *)auStack_98);
    Function::setParams(pFVar4,(Type)runner_local);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_98);
    Builder::clearLocalNames(pFVar4);
  }
  newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  newIndexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ppFVar3 = (local_60->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar10 = (local_60->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppFVar10 != ppFVar3;
      ppFVar10 = ppFVar10 + 1) {
    local_64 = Builder::addVar(*ppFVar10,TVar11);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98,&local_64);
  }
  uVar18 = 0;
  do {
    uVar20 = (ulong)uVar18;
    ppFVar10 = (local_60->super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_60->
                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10 >> 3) <= uVar20) {
      ppCVar7 = (local_a0->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar14 = (local_a0->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>).
                      _M_impl.super__Vector_impl_data._M_start; ppCVar14 != ppCVar7;
          ppCVar14 = ppCVar14 + 1) {
        it.index._0_4_ =
             params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
        it.parent = &(*ppCVar14)->operands;
        it.index._4_4_ = 0;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
                  (&((*ppCVar14)->operands).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,it);
      }
      puVar8 = (module_local->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar15 = (module_local->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar8;
          puVar15 = puVar15 + 1) {
        this = &((puVar15->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->value;
        it_00.index._0_4_ =
             params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
        it_00.parent = (ArenaVector<wasm::Expression_*> *)this;
        it_00.index._4_4_ = 0;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::erase
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this,
                   it_00);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
      return true;
    }
    pFVar4 = ppFVar10[uVar20];
    if ((pFVar4->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
      local_1c8.newIndex = *(Index *)((long)(uintptr_t *)auStack_98 + uVar20 * 4);
      local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
      super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.replacep = (Expression **)0x0;
      local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
      super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed = 0;
      local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
      super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
      super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.currFunction = (Function *)0x0;
      local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
      super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.currModule = (Module *)0x0;
      local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
      super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
      super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.removedIndex =
           params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::pushTask
                ((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)&local_1c8,
                 PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::scan,&pFVar4->body);
      while (((long)local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                    super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                    super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) +
             local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
             super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed != 0) {
        if (local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
            super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
            super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
              super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed == 0) {
            __assertion = "usedFixed > 0";
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
            ;
            __function = 
            "T &wasm::SmallVector<wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, 10>::back() [T = wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::Task, N = 10]"
            ;
            uVar18 = 0x5a;
            goto LAB_007aa611;
          }
          p_Var12 = local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                    super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.fixed.
                    _M_elems[local_1c8.
                             super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                             super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.
                             usedFixed - 1].func;
          local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.replacep =
               local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
               super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.fixed._M_elems
               [local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed - 1].
               currp;
          local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed =
               local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
               super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.usedFixed - 1;
        }
        else {
          p_Var12 = local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                    super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].func;
          local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.replacep =
               local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
               super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].currp;
          local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
          super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
               super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task,_std::allocator<wasm::Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
        }
        if (*local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
             super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.replacep ==
            (Expression *)0x0) {
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                        ,0x139,
                        "void wasm::Walker<LocalUpdater, wasm::Visitor<LocalUpdater>>::walk(Expression *&) [SubType = LocalUpdater, VisitorType = wasm::Visitor<LocalUpdater>]"
                       );
        }
        (*p_Var12)(&local_1c8,
                   local_1c8.super_PostWalker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.
                   super_Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>.replacep);
      }
      Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_>::~Walker
                ((Walker<LocalUpdater,_wasm::Visitor<LocalUpdater,_void>_> *)&local_1c8);
      TypeUpdating::handleNonDefaultableLocals(pFVar4,local_78);
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

bool removeParameter(const std::vector<Function*>& funcs,
                     Index index,
                     const std::vector<Call*>& calls,
                     const std::vector<CallRef*>& callRefs,
                     Module* module,
                     PassRunner* runner) {
  assert(funcs.size() > 0);
  auto* first = funcs[0];
#ifndef NDEBUG
  for (auto* func : funcs) {
    assert(func->type == first->type);
  }
#endif

  // Check if none of the calls has a param with side effects that we cannot
  // remove (as if we can remove them, we will simply do that when we remove the
  // parameter). Note: flattening the IR beforehand can help here.
  //
  // It would also be bad if we remove a parameter that causes the type of the
  // call to change, like this:
  //
  //  (call $foo
  //    (unreachable))
  //
  // After removing the parameter the type should change from unreachable to
  // something concrete. We could handle this by updating the type and then
  // propagating that out, or by appending an unreachable after the call, but
  // for simplicity just ignore such cases; if we are called again later then
  // if DCE ran meanwhile then we could optimize.
  auto hasBadEffects = [&](auto* call) {
    auto& operands = call->operands;
    bool hasUnremovable =
      EffectAnalyzer(runner->options, *module, operands[index])
        .hasUnremovableSideEffects();
    bool wouldChangeType = call->type == Type::unreachable && !call->isReturn &&
                           operands[index]->type == Type::unreachable;
    return hasUnremovable || wouldChangeType;
  };
  bool callParamsAreValid =
    std::none_of(calls.begin(), calls.end(), [&](Call* call) {
      return hasBadEffects(call);
    });
  if (!callParamsAreValid) {
    return false;
  }
  bool callRefParamsAreValid =
    std::none_of(callRefs.begin(), callRefs.end(), [&](CallRef* call) {
      return hasBadEffects(call);
    });
  if (!callRefParamsAreValid) {
    return false;
  }

  // The type must be valid for us to handle as a local (since we
  // replace the parameter with a local).
  // TODO: if there are no references at all, we can avoid creating a
  //       local
  bool typeIsValid = TypeUpdating::canHandleAsLocal(first->getLocalType(index));
  if (!typeIsValid) {
    return false;
  }

  // We can do it!

  // Remove the parameter from the function. We must add a new local
  // for uses of the parameter, but cannot make it use the same index
  // (in general).
  auto paramsType = first->getParams();
  std::vector<Type> params(paramsType.begin(), paramsType.end());
  auto type = params[index];
  params.erase(params.begin() + index);
  // TODO: parallelize some of these loops?
  for (auto* func : funcs) {
    func->setParams(Type(params));

    // It's cumbersome to adjust local names - TODO don't clear them?
    Builder::clearLocalNames(func);
  }
  std::vector<Index> newIndexes;
  for (auto* func : funcs) {
    newIndexes.push_back(Builder::addVar(func, type));
  }
  // Update local operations.
  struct LocalUpdater : public PostWalker<LocalUpdater> {
    Index removedIndex;
    Index newIndex;
    LocalUpdater(Function* func, Index removedIndex, Index newIndex)
      : removedIndex(removedIndex), newIndex(newIndex) {
      walk(func->body);
    }
    void visitLocalGet(LocalGet* curr) { updateIndex(curr->index); }
    void visitLocalSet(LocalSet* curr) { updateIndex(curr->index); }
    void updateIndex(Index& index) {
      if (index == removedIndex) {
        index = newIndex;
      } else if (index > removedIndex) {
        index--;
      }
    }
  };
  for (Index i = 0; i < funcs.size(); i++) {
    auto* func = funcs[i];
    if (!func->imported()) {
      LocalUpdater(funcs[i], index, newIndexes[i]);
      TypeUpdating::handleNonDefaultableLocals(func, *module);
    }
  }

  // Remove the arguments from the calls.
  for (auto* call : calls) {
    call->operands.erase(call->operands.begin() + index);
  }
  for (auto* call : callRefs) {
    call->operands.erase(call->operands.begin() + index);
  }

  return true;
}